

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O0

bool peparse::getResources
               (bounded_buffer *b,bounded_buffer *fileBegin,
               vector<peparse::section,_std::allocator<peparse::section>_> *secs,
               vector<peparse::resource,_std::allocator<peparse::resource>_> *rsrcs)

{
  bool bVar1;
  long in_RDI;
  section s;
  const_iterator __end1;
  const_iterator __begin1;
  vector<peparse::section,_std::allocator<peparse::section>_> *__range1;
  vector<peparse::resource,_std::allocator<peparse::resource>_> *in_stack_00000428;
  resource_dir_entry *in_stack_00000430;
  uint32_t in_stack_0000043c;
  uint32_t in_stack_00000440;
  uint32_t in_stack_00000444;
  bounded_buffer *in_stack_00000448;
  int in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  section *in_stack_ffffffffffffff40;
  int local_a8;
  section local_98;
  section *local_40;
  __normal_iterator<const_peparse::section_*,_std::vector<peparse::section,_std::allocator<peparse::section>_>_>
  local_38 [6];
  byte local_1;
  
  if (in_RDI == 0) {
    local_1 = 0;
  }
  else {
    local_38[0]._M_current =
         (section *)
         std::vector<peparse::section,_std::allocator<peparse::section>_>::begin
                   ((vector<peparse::section,_std::allocator<peparse::section>_> *)
                    CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    local_40 = (section *)
               std::vector<peparse::section,_std::allocator<peparse::section>_>::end
                         ((vector<peparse::section,_std::allocator<peparse::section>_> *)
                          CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_peparse::section_*,_std::vector<peparse::section,_std::allocator<peparse::section>_>_>
                               *)in_stack_ffffffffffffff40,
                              (__normal_iterator<const_peparse::section_*,_std::vector<peparse::section,_std::allocator<peparse::section>_>_>
                               *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38)),
          bVar1) {
      __gnu_cxx::
      __normal_iterator<const_peparse::section_*,_std::vector<peparse::section,_std::allocator<peparse::section>_>_>
      ::operator*(local_38);
      in_stack_ffffffffffffff40 = &local_98;
      section::section(in_stack_ffffffffffffff40,
                       (section *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      bVar1 = std::operator!=(&in_stack_ffffffffffffff40->sectionName,
                              (char *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38))
      ;
      if (bVar1) {
        local_a8 = 3;
      }
      else {
        bVar1 = parse_resource_table
                          (in_stack_00000448,in_stack_00000444,in_stack_00000440,in_stack_0000043c,
                           in_stack_00000430,in_stack_00000428);
        in_stack_ffffffffffffff3c = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff3c);
        if (bVar1) {
          local_a8 = 2;
        }
        else {
          local_1 = 0;
          local_a8 = 1;
        }
      }
      section::~section((section *)0x13bac1);
      if (local_a8 == 1) goto LAB_0013baf3;
      if (local_a8 == 2) break;
      __gnu_cxx::
      __normal_iterator<const_peparse::section_*,_std::vector<peparse::section,_std::allocator<peparse::section>_>_>
      ::operator++(local_38);
      in_stack_ffffffffffffff38 = local_a8;
    }
    local_1 = 1;
  }
LAB_0013baf3:
  return (bool)(local_1 & 1);
}

Assistant:

bool getResources(bounded_buffer *b,
                  bounded_buffer *fileBegin,
                  const std::vector<section> secs,
                  std::vector<resource> &rsrcs) {
  static_cast<void>(fileBegin);

  if (b == nullptr)
    return false;

  for (section s : secs) {
    if (s.sectionName != ".rsrc") {
      continue;
    }

    if (!parse_resource_table(
            s.sectionData, 0, s.sec.VirtualAddress, 0, nullptr, rsrcs)) {
      return false;
    }

    break; // Because there should only be one .rsrc
  }

  return true;
}